

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpanel_bmod.c
# Opt level: O3

void cpanel_bmod(int m,int w,int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  flops_t *pfVar9;
  int *piVar10;
  int *piVar11;
  int_t *piVar12;
  int_t *piVar13;
  void *pvVar14;
  int_t *piVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  float *pfVar25;
  int *piVar26;
  singlecomplex *psVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  singlecomplex *psVar31;
  int nrow;
  long lVar32;
  ulong uVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  singlecomplex *psVar43;
  float fVar44;
  float fVar51;
  singlecomplex sVar45;
  singlecomplex sVar46;
  singlecomplex sVar47;
  singlecomplex sVar48;
  singlecomplex sVar49;
  singlecomplex sVar50;
  float fVar52;
  float fVar55;
  singlecomplex sVar53;
  singlecomplex sVar54;
  float fVar56;
  singlecomplex sVar57;
  singlecomplex sVar58;
  float fVar59;
  singlecomplex sVar60;
  singlecomplex sVar61;
  singlecomplex sVar62;
  singlecomplex sVar63;
  int local_17c;
  
  pfVar9 = stat->ops;
  piVar10 = Glu->xsup;
  piVar11 = Glu->supno;
  piVar12 = Glu->lsub;
  piVar13 = Glu->xlsub;
  pvVar14 = Glu->lusup;
  piVar15 = Glu->xlusup;
  iVar17 = sp_ienv(3);
  iVar18 = sp_ienv(7);
  iVar17 = sp_ienv((uint)(iVar17 <= iVar18) * 4 + 3);
  iVar18 = sp_ienv(4);
  iVar19 = sp_ienv(5);
  if (0 < nseg) {
    iVar20 = iVar18 + iVar17;
    iVar37 = jcol + w;
    uVar33 = (ulong)(uint)nseg;
    iVar28 = 0;
    do {
      iVar5 = segrep[uVar33 - 1];
      iVar6 = piVar10[piVar11[iVar5]];
      iVar34 = iVar5 - iVar6;
      iVar30 = iVar34 + 1;
      iVar7 = piVar13[iVar6];
      iVar21 = piVar13[(long)iVar6 + 1] - iVar7;
      nrow = iVar21 - iVar30;
      local_17c = iVar7 + iVar34 + 1;
      iVar22 = iVar7 + iVar34;
      if ((iVar30 < iVar19) || (nrow <= iVar18)) {
        if (0 < w) {
          lVar24 = (long)local_17c;
          piVar26 = repfnz;
          psVar31 = dense;
          iVar41 = jcol;
          do {
            iVar39 = piVar26[iVar5];
            if (iVar39 != -1) {
              ncol = (iVar5 - iVar39) + 1;
              iVar40 = piVar15[iVar6];
              pfVar9[0x13] = (float)(int)((iVar5 - iVar39) * ncol * 4) + pfVar9[0x13];
              pfVar9[0x14] = (float)(int)(nrow * 8 * ncol) + pfVar9[0x14];
              if (iVar5 == iVar39) {
                iVar39 = piVar13[(long)iVar6 + 1];
                if (local_17c < iVar39) {
                  fVar51 = psVar31[piVar12[iVar22]].i;
                  fVar44 = psVar31[piVar12[iVar22]].r;
                  pfVar25 = (float *)((long)pvVar14 +
                                     (long)(iVar40 + iVar34 * iVar21 + iVar30) * 8 + 4);
                  lVar29 = lVar24;
                  do {
                    sVar58.r = psVar31[piVar12[lVar29]].r -
                               (pfVar25[-1] * fVar44 + *pfVar25 * -fVar51);
                    sVar58.i = psVar31[piVar12[lVar29]].i -
                               (pfVar25[-1] * fVar51 + *pfVar25 * fVar44);
                    psVar31[piVar12[lVar29]] = sVar58;
                    lVar29 = lVar29 + 1;
                    pfVar25 = pfVar25 + 2;
                  } while (lVar29 < iVar39);
                }
              }
              else if (iVar5 - iVar39 < 3) {
                iVar39 = piVar12[iVar22];
                iVar40 = iVar40 + (iVar21 + 1) * iVar34;
                iVar23 = piVar12[(long)iVar22 + -1];
                lVar29 = (long)(iVar40 - iVar21);
                fVar52 = psVar31[iVar23].r;
                fVar55 = psVar31[iVar23].i;
                fVar44 = psVar31[iVar39].r;
                fVar51 = psVar31[iVar39].i;
                if (ncol == 2) {
                  fVar1 = *(float *)((long)pvVar14 + lVar29 * 8);
                  fVar2 = *(float *)((long)pvVar14 + lVar29 * 8 + 4);
                  sVar47.r = fVar44 - (fVar1 * fVar52 + fVar2 * -fVar55);
                  sVar47.i = fVar51 - (fVar1 * fVar55 + fVar2 * fVar52);
                  psVar31[iVar39] = sVar47;
                  iVar39 = piVar13[(long)iVar6 + 1];
                  if (local_17c < iVar39) {
                    lVar32 = 0;
                    do {
                      fVar44 = *(float *)((long)pvVar14 + lVar32 * 8 + (long)iVar40 * 8 + 8);
                      fVar51 = *(float *)((long)pvVar14 + lVar32 * 8 + (long)iVar40 * 8 + 0xc);
                      fVar1 = *(float *)((long)pvVar14 + lVar32 * 8 + lVar29 * 8 + 8);
                      fVar2 = *(float *)((long)pvVar14 + lVar32 * 8 + lVar29 * 8 + 0xc);
                      sVar61.r = psVar31[piVar12[lVar24 + lVar32]].r -
                                 (fVar1 * fVar52 + fVar2 * -fVar55 +
                                 fVar44 * sVar47.r + fVar51 * -sVar47.i);
                      sVar61.i = psVar31[piVar12[lVar24 + lVar32]].i -
                                 (fVar1 * fVar55 + fVar2 * fVar52 +
                                 fVar44 * sVar47.i + fVar51 * sVar47.r);
                      psVar31[piVar12[lVar24 + lVar32]] = sVar61;
                      lVar35 = lVar24 + lVar32;
                      lVar32 = lVar32 + 1;
                    } while (lVar35 + 1 < (long)iVar39);
                  }
                }
                else {
                  lVar32 = (long)((iVar40 - iVar21) - iVar21);
                  fVar56 = psVar31[piVar12[(long)iVar22 + -2]].i;
                  fVar59 = -fVar56;
                  fVar1 = *(float *)((long)pvVar14 + lVar32 * 8 + -8);
                  fVar2 = *(float *)((long)pvVar14 + lVar32 * 8 + -4);
                  fVar3 = *(float *)((long)pvVar14 + lVar32 * 8);
                  fVar4 = *(float *)((long)pvVar14 + lVar32 * 8 + 4);
                  fVar16 = psVar31[piVar12[(long)iVar22 + -2]].r;
                  sVar54.r = fVar52 - (fVar1 * fVar16 + fVar2 * fVar59);
                  sVar54.i = fVar55 - (fVar1 * fVar56 + fVar2 * fVar16);
                  fVar52 = *(float *)((long)pvVar14 + lVar29 * 8);
                  fVar55 = *(float *)((long)pvVar14 + lVar29 * 8 + 4);
                  sVar49.r = fVar44 - (fVar3 * fVar16 + fVar4 * fVar59 +
                                      fVar52 * sVar54.r + fVar55 * -sVar54.i);
                  sVar49.i = fVar51 - (fVar3 * fVar56 + fVar4 * fVar16 +
                                      fVar52 * sVar54.i + fVar55 * sVar54.r);
                  psVar31[iVar39] = sVar49;
                  psVar31[iVar23] = sVar54;
                  iVar39 = piVar13[(long)iVar6 + 1];
                  if (local_17c < iVar39) {
                    lVar32 = lVar29 * 8 + (long)iVar21 * -8 + 0xc;
                    lVar35 = 0;
                    do {
                      fVar44 = *(float *)((long)pvVar14 + lVar35 * 8 + (long)iVar40 * 8 + 8);
                      fVar51 = *(float *)((long)pvVar14 + lVar35 * 8 + (long)iVar40 * 8 + 0xc);
                      fVar52 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar29 * 8 + 8);
                      fVar55 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar29 * 8 + 0xc);
                      fVar1 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar32 + -4);
                      fVar2 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar32);
                      sVar63.r = psVar31[piVar12[lVar24 + lVar35]].r -
                                 (fVar1 * fVar16 + fVar2 * fVar59 +
                                 fVar52 * sVar54.r + fVar55 * -sVar54.i +
                                 fVar44 * sVar49.r + fVar51 * -sVar49.i);
                      sVar63.i = psVar31[piVar12[lVar24 + lVar35]].i -
                                 (fVar1 * fVar56 + fVar2 * fVar16 +
                                 fVar52 * sVar54.i + fVar55 * sVar54.r +
                                 fVar44 * sVar49.i + fVar51 * sVar49.r);
                      psVar31[piVar12[lVar24 + lVar35]] = sVar63;
                      lVar36 = lVar24 + lVar35;
                      lVar35 = lVar35 + 1;
                    } while (lVar36 + 1 < (long)iVar39);
                  }
                }
              }
              else {
                uVar42 = (ulong)(uint)((iVar5 + 1) - iVar39);
                iVar23 = (iVar39 - iVar6) + iVar7;
                uVar38 = 0;
                do {
                  tempv[uVar38] = psVar31[piVar12[(long)iVar23 + uVar38]];
                  uVar38 = uVar38 + 1;
                } while (uVar42 != uVar38);
                iVar40 = iVar40 + (iVar39 - iVar6) * (iVar21 + 1);
                clsolve(iVar21,ncol,(singlecomplex *)((long)pvVar14 + (long)iVar40 * 8),tempv);
                psVar27 = tempv + ncol;
                cmatvec(iVar21,nrow,ncol,
                        (singlecomplex *)((long)pvVar14 + (long)(int)(iVar40 + ncol) * 8),tempv,
                        psVar27);
                uVar38 = 0;
                iVar39 = iVar23;
                do {
                  psVar31[piVar12[(long)iVar23 + uVar38]] = tempv[uVar38];
                  tempv[uVar38].r = 0.0;
                  tempv[uVar38].i = 0.0;
                  uVar38 = uVar38 + 1;
                  iVar39 = iVar39 + 1;
                } while (uVar42 != uVar38);
                if (0 < nrow) {
                  lVar29 = 0;
                  do {
                    sVar48.r = psVar31[piVar12[iVar39 + lVar29]].r - psVar27[lVar29].r;
                    sVar48.i = psVar31[piVar12[iVar39 + lVar29]].i - psVar27[lVar29].i;
                    psVar31[piVar12[iVar39 + lVar29]] = sVar48;
                    psVar27[lVar29].r = 0.0;
                    psVar27[lVar29].i = 0.0;
                    lVar29 = lVar29 + 1;
                  } while (lVar29 < nrow);
                }
              }
            }
            iVar41 = iVar41 + 1;
            piVar26 = piVar26 + m;
            psVar31 = psVar31 + m;
          } while (iVar41 < iVar37);
        }
      }
      else {
        if (0 < w) {
          lVar24 = (long)local_17c;
          psVar27 = tempv;
          psVar31 = dense;
          piVar26 = repfnz;
          iVar41 = jcol;
          do {
            iVar39 = piVar26[iVar5];
            if (iVar39 != -1) {
              iVar40 = (iVar5 - iVar39) + 1;
              iVar23 = piVar15[iVar6];
              pfVar9[0x13] = (float)((iVar5 - iVar39) * iVar40 * 4) + pfVar9[0x13];
              pfVar9[0x14] = (float)(nrow * 8 * iVar40) + pfVar9[0x14];
              if (iVar5 == iVar39) {
                iVar39 = piVar13[(long)iVar6 + 1];
                if (local_17c < iVar39) {
                  fVar51 = psVar31[piVar12[iVar22]].i;
                  fVar44 = psVar31[piVar12[iVar22]].r;
                  pfVar25 = (float *)((long)pvVar14 +
                                     (long)(iVar23 + iVar34 * iVar21 + iVar30) * 8 + 4);
                  lVar29 = lVar24;
                  do {
                    sVar57.r = psVar31[piVar12[lVar29]].r -
                               (pfVar25[-1] * fVar44 + *pfVar25 * -fVar51);
                    sVar57.i = psVar31[piVar12[lVar29]].i -
                               (pfVar25[-1] * fVar51 + *pfVar25 * fVar44);
                    psVar31[piVar12[lVar29]] = sVar57;
                    lVar29 = lVar29 + 1;
                    pfVar25 = pfVar25 + 2;
                  } while (lVar29 < iVar39);
                }
              }
              else if (iVar5 - iVar39 < 3) {
                iVar39 = piVar12[iVar22];
                iVar8 = piVar12[(long)iVar22 + -1];
                iVar23 = iVar23 + (iVar21 + 1) * iVar34;
                lVar29 = (long)(iVar23 - iVar21);
                fVar52 = psVar31[iVar8].r;
                fVar55 = psVar31[iVar8].i;
                fVar44 = psVar31[iVar39].r;
                fVar51 = psVar31[iVar39].i;
                if (iVar40 == 2) {
                  fVar1 = *(float *)((long)pvVar14 + lVar29 * 8);
                  fVar2 = *(float *)((long)pvVar14 + lVar29 * 8 + 4);
                  sVar45.r = fVar44 - (fVar1 * fVar52 + fVar2 * -fVar55);
                  sVar45.i = fVar51 - (fVar1 * fVar55 + fVar2 * fVar52);
                  psVar31[iVar39] = sVar45;
                  iVar39 = piVar13[(long)iVar6 + 1];
                  if (local_17c < iVar39) {
                    lVar32 = 0;
                    do {
                      fVar44 = *(float *)((long)pvVar14 + lVar32 * 8 + (long)iVar23 * 8 + 8);
                      fVar51 = *(float *)((long)pvVar14 + lVar32 * 8 + (long)iVar23 * 8 + 0xc);
                      fVar1 = *(float *)((long)pvVar14 + lVar32 * 8 + lVar29 * 8 + 8);
                      fVar2 = *(float *)((long)pvVar14 + lVar32 * 8 + lVar29 * 8 + 0xc);
                      sVar60.r = psVar31[piVar12[lVar24 + lVar32]].r -
                                 (fVar1 * fVar52 + fVar2 * -fVar55 +
                                 fVar44 * sVar45.r + fVar51 * -sVar45.i);
                      sVar60.i = psVar31[piVar12[lVar24 + lVar32]].i -
                                 (fVar1 * fVar55 + fVar2 * fVar52 +
                                 fVar44 * sVar45.i + fVar51 * sVar45.r);
                      psVar31[piVar12[lVar24 + lVar32]] = sVar60;
                      lVar35 = lVar24 + lVar32;
                      lVar32 = lVar32 + 1;
                    } while (lVar35 + 1 < (long)iVar39);
                  }
                }
                else {
                  lVar32 = (long)((iVar23 - iVar21) - iVar21);
                  fVar56 = psVar31[piVar12[(long)iVar22 + -2]].i;
                  fVar59 = -fVar56;
                  fVar1 = *(float *)((long)pvVar14 + lVar32 * 8 + -8);
                  fVar2 = *(float *)((long)pvVar14 + lVar32 * 8 + -4);
                  fVar3 = *(float *)((long)pvVar14 + lVar32 * 8);
                  fVar4 = *(float *)((long)pvVar14 + lVar32 * 8 + 4);
                  fVar16 = psVar31[piVar12[(long)iVar22 + -2]].r;
                  sVar53.r = fVar52 - (fVar1 * fVar16 + fVar2 * fVar59);
                  sVar53.i = fVar55 - (fVar1 * fVar56 + fVar2 * fVar16);
                  fVar52 = *(float *)((long)pvVar14 + lVar29 * 8);
                  fVar55 = *(float *)((long)pvVar14 + lVar29 * 8 + 4);
                  sVar46.r = fVar44 - (fVar3 * fVar16 + fVar4 * fVar59 +
                                      fVar52 * sVar53.r + fVar55 * -sVar53.i);
                  sVar46.i = fVar51 - (fVar3 * fVar56 + fVar4 * fVar16 +
                                      fVar52 * sVar53.i + fVar55 * sVar53.r);
                  psVar31[iVar39] = sVar46;
                  psVar31[iVar8] = sVar53;
                  iVar39 = piVar13[(long)iVar6 + 1];
                  if (local_17c < iVar39) {
                    lVar32 = lVar29 * 8 + (long)iVar21 * -8 + 0xc;
                    lVar35 = 0;
                    do {
                      fVar44 = *(float *)((long)pvVar14 + lVar35 * 8 + (long)iVar23 * 8 + 8);
                      fVar51 = *(float *)((long)pvVar14 + lVar35 * 8 + (long)iVar23 * 8 + 0xc);
                      fVar52 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar29 * 8 + 8);
                      fVar55 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar29 * 8 + 0xc);
                      fVar1 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar32 + -4);
                      fVar2 = *(float *)((long)pvVar14 + lVar35 * 8 + lVar32);
                      sVar62.r = psVar31[piVar12[lVar24 + lVar35]].r -
                                 (fVar1 * fVar16 + fVar2 * fVar59 +
                                 fVar52 * sVar53.r + fVar55 * -sVar53.i +
                                 fVar44 * sVar46.r + fVar51 * -sVar46.i);
                      sVar62.i = psVar31[piVar12[lVar24 + lVar35]].i -
                                 (fVar1 * fVar56 + fVar2 * fVar16 +
                                 fVar52 * sVar53.i + fVar55 * sVar53.r +
                                 fVar44 * sVar46.i + fVar51 * sVar46.r);
                      psVar31[piVar12[lVar24 + lVar35]] = sVar62;
                      lVar36 = lVar24 + lVar35;
                      lVar35 = lVar35 + 1;
                    } while (lVar36 + 1 < (long)iVar39);
                  }
                }
              }
              else {
                uVar38 = 0;
                do {
                  psVar27[uVar38] = psVar31[piVar12[(long)(iVar7 + (iVar39 - iVar6)) + uVar38]];
                  uVar38 = uVar38 + 1;
                } while ((uint)((iVar5 + 1) - iVar39) != uVar38);
                clsolve(iVar21,iVar40,
                        (singlecomplex *)
                        ((long)pvVar14 + (long)(iVar23 + (iVar39 - iVar6) * (iVar21 + 1)) * 8),
                        psVar27);
              }
            }
            iVar41 = iVar41 + 1;
            piVar26 = piVar26 + m;
            psVar31 = psVar31 + m;
            psVar27 = psVar27 + iVar20;
          } while (iVar41 < iVar37);
        }
        if (0 < nrow) {
          iVar22 = 0;
          do {
            iVar41 = iVar22 + iVar18;
            iVar34 = iVar41;
            if (nrow < iVar41) {
              iVar34 = nrow;
            }
            iVar39 = iVar34 - iVar22;
            if (iVar18 < iVar34 - iVar22) {
              iVar39 = iVar18;
            }
            if (0 < w) {
              iVar34 = piVar15[iVar6];
              piVar26 = repfnz;
              psVar31 = dense;
              psVar43 = tempv + iVar17;
              psVar27 = tempv;
              iVar40 = jcol;
              do {
                iVar23 = piVar26[iVar5];
                if (((iVar23 != -1) && (2 < iVar5 - iVar23)) &&
                   (cmatvec(iVar21,iVar39,(iVar5 - iVar23) + 1,
                            (singlecomplex *)
                            ((long)pvVar14 +
                            (long)((iVar23 - iVar6) * iVar21 + iVar22 + iVar30 + iVar34) * 8),
                            psVar27,psVar27 + iVar17), 0 < iVar39)) {
                  lVar24 = 0;
                  do {
                    sVar50.r = psVar31[piVar12[local_17c + lVar24]].r - psVar43[lVar24].r;
                    sVar50.i = psVar31[piVar12[local_17c + lVar24]].i - psVar43[lVar24].i;
                    psVar31[piVar12[local_17c + lVar24]] = sVar50;
                    psVar43[lVar24].r = 0.0;
                    psVar43[lVar24].i = 0.0;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < iVar39);
                }
                iVar40 = iVar40 + 1;
                piVar26 = piVar26 + m;
                psVar31 = psVar31 + m;
                psVar27 = psVar27 + iVar20;
                psVar43 = psVar43 + iVar20;
              } while (iVar40 < iVar37);
            }
            local_17c = local_17c + iVar18;
            iVar22 = iVar41;
          } while (iVar41 < nrow);
        }
        if (0 < w) {
          psVar27 = tempv;
          piVar26 = repfnz;
          psVar31 = dense;
          iVar21 = jcol;
          do {
            iVar22 = piVar26[iVar5];
            if ((iVar22 != -1) && (2 < iVar5 - iVar22)) {
              uVar38 = 0;
              do {
                psVar31[piVar12[(long)((iVar7 - iVar6) + iVar22) + uVar38]] = psVar27[uVar38];
                psVar27[uVar38].r = 0.0;
                psVar27[uVar38].i = 0.0;
                uVar38 = uVar38 + 1;
              } while ((uint)((iVar5 + 1) - iVar22) != uVar38);
            }
            iVar21 = iVar21 + 1;
            piVar26 = piVar26 + m;
            psVar31 = psVar31 + m;
            psVar27 = psVar27 + iVar20;
          } while (iVar21 < iVar37);
        }
      }
      uVar33 = uVar33 - 1;
      iVar28 = iVar28 + 1;
    } while (iVar28 != nseg);
  }
  return;
}

Assistant:

void
cpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    singlecomplex     *dense,     /* out, of size n by w */
	    singlecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    singlecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    singlecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    singlecomplex       *dense_col;  /* dense[] for a column in the panel */
    singlecomplex       *tempv1;             /* Used in 1-D update */
    singlecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    clsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    cgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    cmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    clsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    cmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}